

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O1

void __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<std::shared_ptr<chaiscript::AST_Node>_(const_std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_&),_chaiscript::dispatch::detail::Fun_Caller<std::shared_ptr<chaiscript::AST_Node>,_const_std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_&>_>
::~Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<std::shared_ptr<chaiscript::AST_Node>_(const_std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_&),_chaiscript::dispatch::detail::Fun_Caller<std::shared_ptr<chaiscript::AST_Node>,_const_std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_&>_>
           *this)

{
  pointer pTVar1;
  
  (this->super_Proxy_Function_Impl_Base).super_Proxy_Function_Base._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Proxy_Function_Base_00312c80;
  pTVar1 = (this->super_Proxy_Function_Impl_Base).super_Proxy_Function_Base.m_types.
           super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pTVar1 != (pointer)0x0) {
    operator_delete(pTVar1,(long)(this->super_Proxy_Function_Impl_Base).super_Proxy_Function_Base.
                                 m_types.
                                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pTVar1);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

virtual ~Proxy_Function_Callable_Impl() {}